

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppm.cpp
# Opt level: O2

void embree::storePPM(Ref<embree::Image> *img,FileName *fileName)

{
  ostream *poVar1;
  Image *pIVar2;
  size_t x;
  ulong uVar3;
  ulong uVar4;
  undefined4 uVar5;
  float fVar6;
  Color4 c;
  fstream file;
  ostream local_228 [512];
  
  std::fstream::fstream(&file);
  std::ios::exceptions((int)&file + (int)*(undefined8 *)(_file + -0x18));
  std::fstream::open((char *)&file,(_Ios_Openmode)(fileName->filename)._M_dataplus._M_p);
  poVar1 = std::operator<<(local_228,"P6");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_228);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = (ostream *)std::ostream::operator<<(local_228,0xff);
  std::endl<char,std::char_traits<char>>(poVar1);
  pIVar2 = img->ptr;
  for (uVar4 = 0; uVar4 < pIVar2->height; uVar4 = uVar4 + 1) {
    for (uVar3 = 0; uVar3 < pIVar2->width; uVar3 = uVar3 + 1) {
      (*(pIVar2->super_RefCount)._vptr_RefCount[4])(&c,pIVar2,uVar3,uVar4);
      uVar5 = c.field_0.m128[0];
      if (1.0 <= c.field_0.m128[0]) {
        uVar5 = 1.0;
      }
      fVar6 = 0.0;
      if (0.0 <= (float)uVar5) {
        fVar6 = (float)uVar5;
      }
      std::operator<<(local_228,(char)(int)(fVar6 * 255.0));
      uVar5 = c.field_0.m128[1];
      if (1.0 <= c.field_0.m128[1]) {
        uVar5 = 1.0;
      }
      fVar6 = 0.0;
      if (0.0 <= (float)uVar5) {
        fVar6 = (float)uVar5;
      }
      std::operator<<(local_228,(char)(int)(fVar6 * 255.0));
      uVar5 = c.field_0.m128[2];
      if (1.0 <= c.field_0.m128[2]) {
        uVar5 = 1.0;
      }
      fVar6 = 0.0;
      if (0.0 <= (float)uVar5) {
        fVar6 = (float)uVar5;
      }
      std::operator<<(local_228,(char)(int)(fVar6 * 255.0));
      pIVar2 = img->ptr;
    }
  }
  std::fstream::~fstream(&file);
  return;
}

Assistant:

void storePPM(const Ref<Image>& img, const FileName& fileName)
  {
    /* open file for writing */
    std::fstream file;
    file.exceptions (std::fstream::failbit | std::fstream::badbit);
    file.open (fileName.c_str(), std::fstream::out | std::fstream::binary);

    /* write file header */
    file << "P6" << std::endl;
    file << img->width << " " << img->height << std::endl;
    file << 255 << std::endl;

    /* write image */
    for (size_t y=0; y<img->height; y++) {
      for (size_t x=0; x<img->width; x++) {
        const Color4 c = img->get(x,y);
        file << (unsigned char)(clamp(c.r)*255.0f);
        file << (unsigned char)(clamp(c.g)*255.0f);
        file << (unsigned char)(clamp(c.b)*255.0f);
      }
    }
  }